

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

void once_cb(uv_timer_t *handle)

{
  int iVar1;
  uv_loop_t *loop;
  uv_handle_t *handle_00;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  void *local_10;
  
  printf("ONCE_CB %d\n",(ulong)(uint)once_cb_called);
  if (handle == (uv_timer_t *)0x0) {
    once_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active((uv_handle_t *)handle);
    local_10 = (void *)(long)iVar1;
    if (local_10 == (void *)0x0) {
      once_cb_called = once_cb_called + 1;
      uv_close((uv_handle_t *)handle,once_close_cb);
      loop = uv_default_loop();
      uv_update_time(loop);
      return;
    }
  }
  handle_00 = (uv_handle_t *)&stack0xfffffffffffffff0;
  once_cb_cold_1();
  puts("REPEAT_CB");
  if (handle_00 == (uv_handle_t *)0x0) {
    repeat_cb_cold_2();
  }
  else {
    iVar1 = uv_is_active(handle_00);
    if (iVar1 == 1) {
      repeat_cb_called = repeat_cb_called + 1;
      if (repeat_cb_called == 5) {
        uv_close(handle_00,repeat_close_cb);
        return;
      }
      return;
    }
  }
  repeat_cb_cold_1();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,0x6f,"never_cb should never be called",in_R9,handle_00);
  fflush(_stderr);
  abort();
}

Assistant:

static void once_cb(uv_timer_t* handle) {
  printf("ONCE_CB %d\n", once_cb_called);

  ASSERT_NOT_NULL(handle);
  ASSERT_OK(uv_is_active((uv_handle_t*) handle));

  once_cb_called++;

  uv_close((uv_handle_t*)handle, once_close_cb);

  /* Just call this randomly for the code coverage. */
  uv_update_time(uv_default_loop());
}